

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O3

void Abc_FlowRetime_Dfs_forw(Abc_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Obj_t *pObj_00;
  void **ppvVar5;
  int in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar6;
  long lVar7;
  
  if ((*(uint *)&pObj->field_0x14 & 0xf) != 8) {
    pAVar4 = pObj->pNtk;
    iVar1 = pObj->Id;
    iVar2 = pAVar4->nTravIds;
    Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,in_EDX);
    if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar4->vTravIds).pArray[iVar1] = iVar2;
    if (0 < (pObj->vFanouts).nSize) {
      lVar7 = 0;
      uVar6 = extraout_RDX;
      do {
        pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar7]];
        pAVar4 = pObj_00->pNtk;
        iVar1 = pObj_00->Id;
        Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,(int)uVar6);
        if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar6 = extraout_RDX_00;
        if ((pAVar4->vTravIds).pArray[iVar1] != pObj_00->pNtk->nTravIds) {
          Abc_FlowRetime_Dfs_forw(pObj_00,vNodes);
          uVar6 = extraout_RDX_01;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (pObj->vFanouts).nSize);
    }
    uVar3 = vNodes->nSize;
    if (uVar3 == vNodes->nCap) {
      if ((int)uVar3 < 0x10) {
        if (vNodes->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc(0x80);
        }
        else {
          ppvVar5 = (void **)realloc(vNodes->pArray,0x80);
        }
        vNodes->pArray = ppvVar5;
        vNodes->nCap = 0x10;
      }
      else {
        if (vNodes->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc((ulong)uVar3 << 4);
        }
        else {
          ppvVar5 = (void **)realloc(vNodes->pArray,(ulong)uVar3 << 4);
        }
        vNodes->pArray = ppvVar5;
        vNodes->nCap = uVar3 * 2;
      }
    }
    else {
      ppvVar5 = vNodes->pArray;
    }
    iVar1 = vNodes->nSize;
    vNodes->nSize = iVar1 + 1;
    ppvVar5[iVar1] = pObj;
  }
  return;
}

Assistant:

void Abc_FlowRetime_Dfs_forw( Abc_Obj_t * pObj, Vec_Ptr_t *vNodes ) {
  Abc_Obj_t *pNext;
  int i;

  if (Abc_ObjIsLatch(pObj)) return;

  Abc_NodeSetTravIdCurrent( pObj );
  
  Abc_ObjForEachFanout( pObj, pNext, i )
    if (!Abc_NodeIsTravIdCurrent( pNext ))
      Abc_FlowRetime_Dfs_forw( pNext, vNodes );

  Vec_PtrPush( vNodes, pObj );
}